

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

_Bool CrawlIdentifierCharacters(Lexer *lexer)

{
  int iVar1;
  ushort *puVar2;
  _Bool _Var3;
  int iVar4;
  long lVar5;
  ushort **ppuVar6;
  char character;
  char cVar7;
  bool bVar8;
  int iVar9;
  
  iVar9 = (lexer->tracker).currentTokenPosition;
  iVar1 = lexer->length;
  character = -1;
  cVar7 = -1;
  if (iVar9 < iVar1) {
    cVar7 = lexer->rawSourceCode[iVar9];
  }
  lVar5 = (long)iVar9 + 1;
  iVar4 = (int)lVar5;
  (lexer->tracker).currentTokenPosition = iVar4;
  if (iVar4 < iVar1) {
    character = lexer->rawSourceCode[lVar5];
  }
  (lexer->tracker).currentTokenPosition = iVar9;
  ppuVar6 = __ctype_b_loc();
  puVar2 = *ppuVar6;
  _Var3 = (_Bool)(cVar7 == '_' | (*(byte *)((long)puVar2 + (long)cVar7 * 2 + 1) & 4) >> 2);
  if (_Var3 != true) {
    return _Var3;
  }
  (lexer->tracker).tokenStart = iVar9;
  bVar8 = false;
  while (((puVar2[character] & 8) != 0 || (_Var3 = IsCharacter(character,"$_"), _Var3))) {
    iVar9 = iVar9 + 1;
    (lexer->tracker).currentTokenPosition = iVar9;
    character = -1;
    if (iVar9 < iVar1) {
      character = lexer->rawSourceCode[iVar9];
    }
    bVar8 = true;
  }
  if (!bVar8) {
    iVar9 = iVar9 + 1;
    (lexer->tracker).currentTokenPosition = iVar9;
  }
  (lexer->tracker).tokenEnd = iVar9;
  return true;
}

Assistant:

bool CrawlIdentifierCharacters(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	char nextChar = PeekNextCharacter(lexer);
	if (isalpha(currentChar) || currentChar == '_'){
		SetTokenStart(lexer);
		char* checkCharacters = "$_";
		bool inside = false;
		while (true){
			if (!isalnum(nextChar) && !IsCharacter(nextChar, checkCharacters)) break;
			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
			inside = true;
		}
		if (!inside) GetNextCharacter(lexer);
		SetTokenEnd(lexer);
		return true;
	}
	return false;
}